

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex001.c
# Opt level: O1

void copy_large_file(void)

{
  void *__ptr;
  FILE *__stream;
  FILE *__s;
  
  __ptr = calloc(1,0x40000000);
  __stream = fopen("/dev/null","r");
  __s = fopen("/dev/null","w");
  fread(__ptr,0x40000000,1,__stream);
  fclose(__stream);
  fwrite(__ptr,0x40000000,1,__s);
  fclose(__s);
  free(__ptr);
  return;
}

Assistant:

void copy_large_file()
{
  int large_size = 1024 * 1024 * 1024;
  char *buf = calloc(1, large_size);
  FILE* fin = fopen("/dev/null", "r");
  FILE* fout = fopen("/dev/null", "w");
  fread(buf, large_size, 1, fin);
  fclose(fin);
  fwrite(buf, large_size, 1, fout);
  fclose(fout);
  free(buf);
}